

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParseTools.cpp
# Opt level: O3

Element * Rml::XMLParseTools::ParseTemplate(Element *element,String *template_name)

{
  Template *this;
  Element *pEVar1;
  ElementDocument *this_00;
  String *filename;
  
  this = TemplateCache::GetTemplate(template_name);
  if (this != (Template *)0x0) {
    pEVar1 = Template::ParseTemplate(this,element);
    return pEVar1;
  }
  this_00 = Element::GetOwnerDocument(element);
  filename = ElementDocument::GetSourceURL_abi_cxx11_(this_00);
  Log::ParseError(filename,-1,"Failed to find template \'%s\'.",(template_name->_M_dataplus)._M_p);
  return element;
}

Assistant:

Element* XMLParseTools::ParseTemplate(Element* element, const String& template_name)
{
	// Load the template, and parse it
	Template* parse_template = TemplateCache::GetTemplate(template_name);
	if (!parse_template)
	{
		Log::ParseError(element->GetOwnerDocument()->GetSourceURL(), -1, "Failed to find template '%s'.", template_name.c_str());
		return element;
	}

	return parse_template->ParseTemplate(element);
}